

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

void __thiscall
SpeciesTracker::TerminateTranslation
          (SpeciesTracker *this,shared_ptr<PolymerWrapper> *wrapper,string *pol_name,
          string *gene_name)

{
  __shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  Increment(this,pol_name,1);
  Increment(this,gene_name,1);
  IncrementRibo(this,gene_name,-1);
  std::__shared_ptr<Reaction,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<PolymerWrapper,void>
            (local_30,&wrapper->super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>);
  Signal<std::shared_ptr<Reaction>_>::Emit
            (&this->propensity_signal_,(shared_ptr<Reaction> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

void SpeciesTracker::TerminateTranslation(
    std::shared_ptr<PolymerWrapper> wrapper, const std::string &pol_name,
    const std::string &gene_name) {
  Increment(pol_name, 1);
  Increment(gene_name, 1);
  IncrementRibo(gene_name, -1);
  propensity_signal_.Emit(wrapper);
  // CountTermination(gene_name);
}